

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

void __thiscall Grammar::buildExtendedGrammar(Grammar *this)

{
  NameList *pNVar1;
  _List_node_base **pp_Var2;
  Name NVar3;
  iterator iVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  long in_FS_OFFSET;
  Rule local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  NVar3 = intern(this,"$accept");
  (this->accept_symbol)._M_node = NVar3._M_node;
  pNVar1 = &local_50.rhs;
  local_50.lhs._M_node = (_List_node_base *)0x0;
  local_50.rhs.
  super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>.
  _M_impl._M_node._M_size = 0;
  local_50.prec._M_node = (_List_node_base *)0x0;
  local_50.rhs.
  super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pNVar1;
  local_50.rhs.
  super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pNVar1;
  iVar4 = std::__cxx11::list<Rule,_std::allocator<Rule>_>::emplace<Rule>
                    (&this->rules,(const_iterator)&this->rules,&local_50);
  (this->goal)._M_node = iVar4._M_node;
  p_Var6 = local_50.rhs.
           super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (local_50.rhs.
      super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pNVar1) {
    do {
      p_Var5 = (((_List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                  *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var6,0x18);
      p_Var6 = p_Var5;
    } while (p_Var5 != (_List_node_base *)pNVar1);
    iVar4._M_node = (this->goal)._M_node;
  }
  iVar4._M_node[1]._M_next = (this->accept_symbol)._M_node;
  p_Var6 = (this->goal)._M_node;
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (this->start)._M_node;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  pp_Var2 = &p_Var6[2]._M_prev;
  *pp_Var2 = (_List_node_base *)((long)&(*pp_Var2)->_M_next + 1);
  p_Var6 = (this->goal)._M_node;
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (this->tk_end)._M_node;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  pp_Var2 = &p_Var6[2]._M_prev;
  *pp_Var2 = (_List_node_base *)((long)&(*pp_Var2)->_M_next + 1);
  std::
  _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
  ::_M_insert_unique<std::_List_iterator<QString>const&>
            ((_Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
              *)&this->non_terminals,&this->accept_symbol);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Grammar::buildExtendedGrammar ()
{
  accept_symbol = intern ("$accept");
  goal = rules.insert (rules.end (), Rule ());
  goal->lhs = accept_symbol;
  goal->rhs.push_back (start);
  goal->rhs.push_back (tk_end);

  non_terminals.insert (accept_symbol);
}